

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O2

int RAWToRGBA(uint8_t *src_raw,int src_stride_raw,uint8_t *dst_rgba,int dst_stride_rgba,int width,
             int height)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int local_3c;
  code *local_38;
  
  if ((height == 0 || width < 1) || (dst_rgba == (uint8_t *)0x0 || src_raw == (uint8_t *)0x0)) {
    iVar1 = -1;
  }
  else {
    iVar1 = height;
    if (height < 0) {
      iVar1 = -height;
      src_raw = src_raw + ~height * src_stride_raw;
      src_stride_raw = -src_stride_raw;
    }
    local_3c = dst_stride_rgba;
    if (width * 4 == dst_stride_rgba && width * 3 == src_stride_raw) {
      width = iVar1 * width;
      iVar1 = 1;
      src_stride_raw = 0;
      local_3c = 0;
    }
    iVar2 = libyuv::TestCpuFlag(0x40);
    if ((width & 0xfU) == 0) {
      local_38 = RAWToRGBARow_SSSE3;
    }
    else {
      local_38 = RAWToRGBARow_Any_SSSE3;
    }
    if (iVar2 == 0) {
      local_38 = RAWToRGBARow_C;
    }
    while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
      (*local_38)(src_raw,dst_rgba,width);
      src_raw = src_raw + src_stride_raw;
      dst_rgba = dst_rgba + local_3c;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int RAWToRGBA(const uint8_t* src_raw,
              int src_stride_raw,
              uint8_t* dst_rgba,
              int dst_stride_rgba,
              int width,
              int height) {
  int y;
  void (*RAWToRGBARow)(const uint8_t* src_rgb, uint8_t* dst_rgba, int width) =
      RAWToRGBARow_C;
  if (!src_raw || !dst_rgba || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_raw = src_raw + (height - 1) * src_stride_raw;
    src_stride_raw = -src_stride_raw;
  }
  // Coalesce rows.
  if (src_stride_raw == width * 3 && dst_stride_rgba == width * 4) {
    width *= height;
    height = 1;
    src_stride_raw = dst_stride_rgba = 0;
  }
#if defined(HAS_RAWTORGBAROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    RAWToRGBARow = RAWToRGBARow_Any_SSSE3;
    if (IS_ALIGNED(width, 16)) {
      RAWToRGBARow = RAWToRGBARow_SSSE3;
    }
  }
#endif
#if defined(HAS_RAWTORGBAROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    RAWToRGBARow = RAWToRGBARow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      RAWToRGBARow = RAWToRGBARow_NEON;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    RAWToRGBARow(src_raw, dst_rgba, width);
    src_raw += src_stride_raw;
    dst_rgba += dst_stride_rgba;
  }
  return 0;
}